

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePushOverrideID(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  ImGuiID id_local;
  
  window._4_4_ = id;
  pIVar1 = GetCurrentWindow();
  Indent(0.0);
  (pIVar1->DC).TreeDepth = (pIVar1->DC).TreeDepth + 1;
  ImVector<unsigned_int>::push_back(&pIVar1->IDStack,(uint *)((long)&window + 4));
  return;
}

Assistant:

void ImGui::TreePushOverrideID(ImGuiID id)
{
    ImGuiWindow* window = GetCurrentWindow();
    Indent();
    window->DC.TreeDepth++;
    window->IDStack.push_back(id);
}